

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Argument_Binding::MergeFrom
          (Argument_Binding *this,Argument_Binding *from)

{
  void *pvVar1;
  LogMessage *other;
  Value *this_00;
  Value *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
               ,0x83f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 1) {
    set_name(this,(string *)(from->binding_).value_);
  }
  else if (from->_oneof_case_[0] == 2) {
    this_00 = mutable_value(this);
    from_00 = value(from);
    Value::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void Argument_Binding::MergeFrom(const Argument_Binding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Argument.Binding)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.binding_case()) {
    case kName: {
      set_name(from.name());
      break;
    }
    case kValue: {
      mutable_value()->::CoreML::Specification::MILSpec::Value::MergeFrom(from.value());
      break;
    }
    case BINDING_NOT_SET: {
      break;
    }
  }
}